

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O0

gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> * __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::calrho(gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>
         *__return_storage_ptr__,
        WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
        *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *_dim,pEnsemble *_V)

{
  iterator iVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  type this_00;
  ulong uVar5;
  const_reference pvVar6;
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> *_gnarr;
  pointer ppVar7;
  element_type *peVar8;
  double *pdVar9;
  double extraout_XMM0_Qa;
  valtype vVar10;
  _Self local_e0;
  _Self local_d8;
  iterator rhoit;
  valtype rhov;
  undefined1 local_c0 [4];
  uint i_1;
  coordtype rhocoord;
  valtype weight;
  valtype exparg;
  vector<double,_std::allocator<double>_> vals;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histids;
  undefined1 local_58 [8];
  coordtype coord;
  _Self local_38;
  const_iterator it;
  uint i;
  pEnsemble *_V_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *_dim_local;
  WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
  *this_local;
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> *rho;
  
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_dim);
  if (this->dim < sVar3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"The number of dimension can\'t be larger than ")
    ;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->dim);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  std::operator<<((ostream *)&std::cout,"#Calculating probability density along dimension: ");
  this_00 = FormatStream<std::ostream>::operator<<((FormatStream<std::ostream> *)&fcout,_dim);
  FormatStream<std::basic_ostream<char,_std::char_traits<char>_>_>::operator<<
            (this_00,std::endl<char,std::char_traits<char>>);
  it._M_node._4_4_ = 0;
  while( true ) {
    uVar5 = (ulong)it._M_node._4_4_;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_dim);
    if (sVar3 <= uVar5) {
      it._M_node._3_1_ = 0;
      _gnarr = DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
               ::getdosarr(&this->DOS);
      gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>::gnarray
                (__return_storage_ptr__,_gnarr,_dim);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::begin(&this->record);
      while( true ) {
        coord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::end(&this->record);
        bVar2 = std::operator!=(&local_38,
                                (_Self *)&coord.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar2) break;
        ppVar7 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_38);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,&ppVar7->first);
        ppVar7 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_38);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&ppVar7->second);
        coord2val((vector<double,_std::allocator<double>_> *)&exparg,this,(coordtype *)local_58);
        peVar8 = std::__shared_ptr_access<Ensemble,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Ensemble,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)_V);
        (**peVar8->_vptr_Ensemble)(peVar8,&exparg);
        rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)exp(-extraout_XMM0_Qa);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
        for (rhov._4_4_ = 0;
            sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_dim),
            rhov._4_4_ < sVar3; rhov._4_4_ = rhov._4_4_ + 1) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (_dim,(ulong)rhov._4_4_);
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                              (ulong)*pvVar6);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,pvVar6);
        }
        vVar10 = DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
                 ::operator[](&this->DOS,(coordtype *)local_58);
        rhoit._M_node =
             (_Base_ptr)
             (vVar10 * (double)rhocoord.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_d8._M_node =
             (_Base_ptr)
             gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>::find
                       (__return_storage_ptr__,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
        local_e0._M_node =
             (_Base_ptr)
             gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>::end
                       (__return_storage_ptr__);
        bVar2 = std::operator!=(&local_d8,&local_e0);
        iVar1 = rhoit;
        if (bVar2) {
          pdVar9 = gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>
                   ::operator[](__return_storage_ptr__,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
          *pdVar9 = (double)iVar1._M_node + *pdVar9;
        }
        else {
          pdVar9 = gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>
                   ::operator[](__return_storage_ptr__,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
          *pdVar9 = (double)iVar1._M_node;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)&exparg);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator++(&local_38);
      }
      return __return_storage_ptr__;
    }
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_dim,(ulong)it._M_node._4_4_);
    if (this->dim <= *pvVar6) break;
    it._M_node._4_4_ = it._M_node._4_4_ + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "The dimension of probability density must be in the range of [0, ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->dim - 1);
  poVar4 = std::operator<<(poVar4,"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

NARRAY WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::calrho(const vector<uint>& _dim, const pEnsemble& _V) const {

  if(_dim.size() > dim) {
    cerr << "The number of dimension can't be larger than " << dim << endl;
    exit(-1);
  }

  cout << "#Calculating probability density along dimension: ";
  fcout << _dim << endl;

  //Construct the total bin-size in all the dimension 
  /*valtype binsize_sub = 1;
  for(uint i = 0; i < binsize.size(); ++i) {
    binsize_sub *= binsize[i];
    cout << "# " << i << " binsize_sub = " << binsize_sub << endl;
  }*/
  //Check if the _dim actually make sense, i.e., if they are in the range of [0, DOS.dim-1]
  //project out all the dimension irrelevent to the PMF BTW
  for(uint i = 0; i < _dim.size(); ++i) {
    if(_dim[i] >= dim) {
      cerr << "The dimension of probability density must be in the range of [0, " << dim-1  << "]" << endl;;
      exit(-1);
    }
    //const uint dimindex = _dim[i];
    //binsize_sub /= binsize[dimindex];
  }

  NARRAY rho(DOS.getdosarr(),_dim);
  //Again we only loop through non-zero elements of DOS
  for(map<coordtype, vector<uint> >::const_iterator it = record.begin(); it != record.end(); ++it) {
    const coordtype coord = it->first;
    const vector<uint> histids = it->second;
    const vector<valtype> vals = coord2val(coord);
    const valtype exparg = -_V->ener(vals);
    //if(exparg > MAXEXPARG ) { cerr << "In WHAM::calrho: exp("<<exparg<<") will overflow!\n"; exit(-1); }
    //else if(exparg < MINEXPARG) { continue; }
    const valtype weight = exp(exparg);

    //construct a vector<uint> as the coordinate of the PMF
    coordtype rhocoord;
    for(uint i = 0; i < _dim.size(); ++i) {
      rhocoord.push_back(coord[_dim[i]]);
    }
    
    //Update the PMF
    //cout << "#DOS[coord] = " << DOS[coord] << " exparg = " << exparg << " weight = " << weight << " binsize_sub = " << binsize_sub << endl;
    const valtype rhov = DOS[coord]*weight; //There should be a binsize factor here but if we only care about relative probability (density), it cancels out in the ratio
                                            //The reason why I didn't multiply with the binsize factor is that it could get very large in multidimensional cases
    const typename NARRAY::iterator rhoit = rho.find(rhocoord);
    if( rhoit != rho.end()) {
      rho[rhocoord] += rhov;
    }
    else {
      rho[rhocoord] = rhov; 
    }
  }
  return rho;
}